

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.hpp
# Opt level: O2

void __thiscall gdsAREF::~gdsAREF(gdsAREF *this)

{
  std::__cxx11::string::~string((string *)&this->propvalue);
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

gdsAREF(){}